

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue3i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x,
               GLint y,GLint z)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<int[3]> local_1d8;
  undefined1 local_1a8 [384];
  
  local_1d8.m_value[1] = -0x21212122;
  local_1d8.m_value[2] = -0x21212122;
  local_1d8.m_postguard[0] = -0x21212122;
  local_1d8.m_postguard[1] = -0x21212122;
  local_1d8.m_preguard[0] = -0x21212122;
  local_1d8.m_preguard[1] = -0x21212122;
  local_1d8.m_preguard[2] = -0x21212122;
  local_1d8.m_value[0] = -0x21212122;
  local_1d8.m_postguard[2] = -0x21212122;
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,local_1d8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::verifyValidity
                    (&local_1d8,testCtx);
  if ((bVar1) &&
     (((local_1d8.m_value[0] != x || (local_1d8.m_value[1] != y)) || (local_1d8.m_value[2] != z))))
  {
    local_1a8._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ERROR: expected [",0x14);
    std::ostream::operator<<(this,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,z);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]; got [",8);
    std::ostream::operator<<(this,local_1d8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,local_1d8.m_value[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,local_1d8.m_value[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue3i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x, GLint y, GLint z)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[3]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}